

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O3

void __thiscall PathBuilder::add(PathBuilder *this,Point a,Point b)

{
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *pmVar1;
  undefined1 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  long lVar5;
  Point PVar6;
  _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
  *p_Var7;
  PathBuilder *pPVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  key_type *__k;
  mapped_type mVar14;
  _Base_ptr p_Var15;
  Point *pPVar16;
  char cVar17;
  _Base_ptr p_Var18;
  deque<Point,std::allocator<Point>> *pdVar19;
  long lVar20;
  char cVar21;
  ulong uVar22;
  long lVar23;
  _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
  *p_Var24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_Point,_int>_>,_std::_Rb_tree_iterator<std::pair<const_Point,_int>_>_>
  pVar28;
  Point local_1c0;
  Point local_1b8;
  char local_1a9;
  _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
  *local_1a8;
  _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
  *local_1a0;
  PathBuilder *local_198;
  _Base_ptr local_190;
  _Base_ptr local_188;
  uint local_17c;
  iterator local_178;
  _Deque_iterator<Point,_Point_&,_Point_*> local_158;
  _Deque_iterator<Point,_Point_&,_Point_*> local_138;
  const_iterator local_118;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_f8;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_d8;
  const_iterator local_b8;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_98;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_78;
  const_iterator local_58;
  
  pmVar1 = &this->backs;
  local_1c0 = a;
  local_1b8 = b;
  local_188 = (_Base_ptr)
              std::
              _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::find((_Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      *)pmVar1,&local_1c0);
  puVar2 = &this->field_0x50;
  local_1a0 = (_Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               *)pmVar1;
  iVar9 = std::
          _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
          ::find((_Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                  *)pmVar1,&local_1b8);
  pmVar1 = &this->fronts;
  iVar10 = std::
           _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
           ::find((_Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                   *)pmVar1,&local_1c0);
  p_Var18 = (_Base_ptr)&this->field_0x20;
  local_1a8 = (_Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               *)pmVar1;
  local_198 = this;
  iVar11 = std::
           _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
           ::find((_Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                   *)pmVar1,&local_1b8);
  p_Var24 = local_1a0;
  PVar6 = local_1c0;
  local_190 = (_Base_ptr)puVar2;
  if ((iVar9._M_node == (_Base_ptr)puVar2) && (iVar10._M_node == p_Var18)) {
    bVar25 = false;
    uVar22 = 0;
    iVar9._M_node = local_188;
  }
  else {
    local_1c0 = local_1b8;
    local_1b8 = PVar6;
    iVar9 = std::
            _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
            ::find(local_1a0,&local_1c0);
    iVar11 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(p_Var24,&local_1b8);
    p_Var24 = local_1a8;
    bVar26 = iVar11._M_node != local_190;
    iVar11 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(local_1a8,&local_1c0);
    bVar25 = iVar11._M_node != p_Var18;
    uVar22 = CONCAT71((int7)((ulong)iVar10._M_node >> 8),bVar26) & 0xffffffff;
    iVar11 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(p_Var24,&local_1b8);
  }
  pPVar8 = local_198;
  if (ABS(local_1c0.x - local_1b8.x) < 1e-08) {
    if (ABS(local_1c0.y - local_1b8.y) < 1e-08) {
      return;
    }
  }
  if ((iVar9._M_node == local_190 && iVar11._M_node == p_Var18) && !bVar25) {
    std::
    vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
    ::emplace_back<>(&local_198->paths);
    lVar5 = *(long *)&pPVar8->field_0x8;
    if (*(Point **)(lVar5 + -0x20) == (Point *)(*(long *)(lVar5 + -0x10) + -8)) {
      std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                ((deque<Point,std::allocator<Point>> *)(lVar5 + -0x50),&local_1c0);
    }
    else {
      **(Point **)(lVar5 + -0x20) = local_1c0;
      *(long *)(lVar5 + -0x20) = *(long *)(lVar5 + -0x20) + 8;
    }
    p_Var7 = local_1a0;
    p_Var24 = local_1a8;
    lVar5 = *(long *)&pPVar8->field_0x8;
    if (*(Point **)(lVar5 + -0x20) == (Point *)(*(long *)(lVar5 + -0x10) + -8)) {
      std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                ((deque<Point,std::allocator<Point>> *)(lVar5 + -0x50),&local_1b8);
    }
    else {
      **(Point **)(lVar5 + -0x20) = local_1b8;
      *(long *)(lVar5 + -0x20) = *(long *)(lVar5 + -0x20) + 8;
    }
    lVar5 = *(long *)&pPVar8->field_0x8;
    lVar20 = *(long *)pPVar8;
    pmVar12 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)p_Var24,&local_1c0);
    *pmVar12 = (int)((ulong)(lVar5 - lVar20) >> 4) * -0x33333333 + -1;
    lVar5 = *(long *)&pPVar8->field_0x8;
    lVar20 = *(long *)pPVar8;
    pmVar12 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)p_Var7,&local_1b8);
    *pmVar12 = (int)((ulong)(lVar5 - lVar20) >> 4) * -0x33333333 + -1;
  }
  else {
    bVar26 = iVar11._M_node == p_Var18;
    bVar27 = iVar9._M_node == local_190;
    cVar17 = bVar26;
    if (!bVar26 && !bVar27) {
      local_1a9 = bVar26;
      local_188 = p_Var18;
      pmVar12 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)local_1a8,&local_1b8);
      local_17c = (uint)uVar22;
      iVar4 = *pmVar12;
      pmVar12 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)local_1a0,&local_1c0);
      p_Var24 = local_1a0;
      uVar22 = (ulong)local_17c;
      p_Var18 = local_188;
      cVar17 = local_1a9;
      if ((!bVar25 && (char)local_17c == '\0') && iVar4 == *pmVar12) {
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)local_1a0,&local_1c0);
        lVar5 = *(long *)local_198;
        lVar20 = (long)*pmVar12 * 0x50;
        pPVar16 = *(Point **)(lVar5 + 0x30 + lVar20);
        if (pPVar16 == (Point *)(*(long *)(lVar5 + 0x40 + lVar20) + -8)) {
          std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                    ((deque<Point,std::allocator<Point>> *)(lVar5 + lVar20),&local_1b8);
        }
        else {
          *pPVar16 = local_1b8;
          pdVar19 = (deque<Point,std::allocator<Point>> *)(lVar5 + lVar20) + 0x30;
          *(long *)pdVar19 = *(long *)pdVar19 + 8;
        }
        p_Var7 = local_1a8;
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(p_Var24,&local_1c0);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var24,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(p_Var7,&local_1b8);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var7,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        return;
      }
    }
    p_Var7 = local_1a0;
    p_Var24 = local_1a8;
    cVar21 = (char)uVar22;
    if ((iVar11._M_node != p_Var18) || ((cVar21 != '\x01' || bVar25) || bVar27)) {
      if ((iVar9._M_node == local_190 && cVar21 == '\0') && (bVar25 && cVar17 == '\0')) {
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)local_1a8,&local_1c0);
        iVar4 = *pmVar12;
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)p_Var24,&local_1b8);
        p_Var7 = local_1a0;
        lVar5 = *(long *)local_198;
        lVar20 = (long)*pmVar12 * 0x50;
        p_Var18 = (_Base_ptr)(lVar5 + lVar20);
        p_Var15 = *(_Base_ptr *)(lVar5 + 0x30 + lVar20);
        if (p_Var15 == *(_Base_ptr *)(lVar5 + 0x38 + lVar20)) {
          p_Var15 = p_Var18[2]._M_parent[-1]._M_right + 0x10;
        }
        pdVar19 = (deque<Point,std::allocator<Point>> *)(lVar5 + (long)iVar4 * 0x50);
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(local_1a0,(key_type *)&p_Var15[-1]._M_right);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var7,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        p_Var15 = p_Var18[1]._M_left;
        if (p_Var15 == p_Var18[1]._M_right) {
          p_Var15 = p_Var18[2]._M_parent[-1]._M_right + 0x10;
        }
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)p_Var24,(key_type *)&p_Var15[-1]._M_right);
        *pmVar12 = iVar4;
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(p_Var24,&local_1c0);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var24,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(p_Var24,&local_1b8);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var24,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        local_b8._M_cur = *(_Elt_pointer *)(pdVar19 + 0x10);
        local_b8._M_first = *(_Elt_pointer *)(pdVar19 + 0x18);
        local_b8._M_last = *(_Elt_pointer *)(pdVar19 + 0x20);
        local_b8._M_node = *(_Map_pointer *)(pdVar19 + 0x28);
        local_d8.current._M_cur = (_Elt_pointer)p_Var18[1]._M_left;
        local_d8.current._M_first = (_Elt_pointer)p_Var18[1]._M_right;
        local_d8.current._M_last = *(_Elt_pointer *)(p_Var18 + 2);
        local_d8.current._M_node = (_Map_pointer)p_Var18[2]._M_parent;
        local_f8.current._M_cur = (_Elt_pointer)p_Var18->_M_left;
        local_f8.current._M_first = (_Elt_pointer)p_Var18->_M_right;
        local_f8.current._M_last = *(_Elt_pointer *)(p_Var18 + 1);
        local_f8.current._M_node = (_Map_pointer)p_Var18[1]._M_parent;
        std::deque<Point,std::allocator<Point>>::
        insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
                  (&local_178,pdVar19,&local_b8,&local_d8,&local_f8);
      }
      else {
        if (((bVar26 || bVar27) || bVar25) || cVar21 != '\0') {
          if ((iVar9._M_node == local_190 && cVar21 == '\0') && (cVar17 == '\0' && !bVar25)) {
            pmVar12 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                    *)local_1a8,&local_1b8);
            lVar5 = *(long *)local_198;
            lVar23 = (long)*pmVar12 * 0x50;
            lVar20 = *(long *)(lVar5 + 0x10 + lVar23);
            if (lVar20 == *(long *)(lVar5 + 0x18 + lVar23)) {
              std::deque<Point,std::allocator<Point>>::_M_push_front_aux<Point_const&>
                        ((deque<Point,std::allocator<Point>> *)(lVar5 + lVar23),&local_1c0);
            }
            else {
              *(Point *)(lVar20 + -8) = local_1c0;
              pdVar19 = (deque<Point,std::allocator<Point>> *)(lVar5 + lVar23) + 0x10;
              *(long *)pdVar19 = *(long *)pdVar19 + -8;
            }
            __k = &local_1b8;
            pmVar12 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                    *)p_Var24,__k);
            mVar14 = *pmVar12;
            pPVar16 = &local_1c0;
          }
          else {
            if ((cVar21 != '\0' || bVar25) || (iVar11._M_node != p_Var18 || bVar27)) {
              if (bVar25) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"fronts contains a\n",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    fronts[",0xb);
                operator<<((ostream *)&std::cerr,&local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar12 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                        *)local_1a8,&local_1c0);
                poVar13 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              }
              if (iVar11._M_node != p_Var18) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"fronts contains b\n",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    fronts[",0xb);
                operator<<((ostream *)&std::cerr,&local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar12 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                        *)local_1a8,&local_1b8);
                poVar13 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              }
              if (iVar9._M_node != local_190) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"backs contains a\n",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    backs[",10);
                operator<<((ostream *)&std::cerr,&local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar12 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                        *)local_1a0,&local_1c0);
                poVar13 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              }
              if (cVar21 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"backs contains b\n",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    backs[",10);
                operator<<((ostream *)&std::cerr,&local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar12 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                        *)local_1a0,&local_1b8);
                poVar13 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              }
              poVar13 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1c0.x);
              poVar13 = std::operator<<(poVar13,"\" y1=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1c0.y);
              poVar13 = std::operator<<(poVar13,"\" x2=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1b8.x);
              poVar13 = std::operator<<(poVar13,"\" y2=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1b8.y);
              std::operator<<(poVar13,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />");
              poVar13 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1c0.x + -10.0);
              poVar13 = std::operator<<(poVar13,"\" y1=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1c0.y + -10.0);
              poVar13 = std::operator<<(poVar13,"\" x2=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1c0.x + -20.0);
              poVar13 = std::operator<<(poVar13,"\" y2=\"");
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1c0.y + -20.0);
              std::operator<<(poVar13,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />");
              exit(0x20);
            }
            pmVar12 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                    *)local_1a0,&local_1c0);
            lVar5 = *(long *)local_198;
            lVar20 = (long)*pmVar12 * 0x50;
            pPVar16 = *(Point **)(lVar5 + 0x30 + lVar20);
            if (pPVar16 == (Point *)(*(long *)(lVar5 + 0x40 + lVar20) + -8)) {
              std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                        ((deque<Point,std::allocator<Point>> *)(lVar5 + lVar20),&local_1b8);
            }
            else {
              *pPVar16 = local_1b8;
              pdVar19 = (deque<Point,std::allocator<Point>> *)(lVar5 + lVar20) + 0x30;
              *(long *)pdVar19 = *(long *)pdVar19 + 8;
            }
            __k = &local_1c0;
            pmVar12 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                    *)p_Var7,__k);
            mVar14 = *pmVar12;
            pPVar16 = &local_1b8;
            p_Var24 = p_Var7;
          }
          pmVar12 = std::
                    map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                    ::operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                                  *)p_Var24,pPVar16);
          *pmVar12 = mVar14;
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *)
                p_Var24,__k);
          return;
        }
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)local_1a0,&local_1c0);
        p_Var24 = local_1a8;
        iVar4 = *pmVar12;
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)local_1a8,&local_1b8);
        lVar5 = *(long *)local_198;
        pdVar19 = (deque<Point,std::allocator<Point>> *)((long)iVar4 * 0x50 + lVar5);
        lVar20 = (long)*pmVar12 * 0x50;
        p_Var18 = (_Base_ptr)(lVar5 + lVar20);
        p_Var15 = *(_Base_ptr *)(lVar5 + 0x30 + lVar20);
        if (p_Var15 == *(_Base_ptr *)(lVar5 + 0x38 + lVar20)) {
          p_Var15 = p_Var18[2]._M_parent[-1]._M_right + 0x10;
        }
        pmVar12 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                              *)p_Var7,(key_type *)&p_Var15[-1]._M_right);
        *pmVar12 = iVar4;
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(p_Var24,&local_1c0);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var24,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        pVar28 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(p_Var24,&local_1b8);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(p_Var24,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
        local_118._M_cur = *(_Elt_pointer *)(pdVar19 + 0x30);
        local_118._M_first = *(_Elt_pointer *)(pdVar19 + 0x38);
        local_118._M_last = *(_Elt_pointer *)(pdVar19 + 0x40);
        local_118._M_node = *(_Map_pointer *)(pdVar19 + 0x48);
        local_138._M_cur = (_Elt_pointer)p_Var18->_M_left;
        local_138._M_first = (_Elt_pointer)p_Var18->_M_right;
        local_138._M_last = *(_Elt_pointer *)(p_Var18 + 1);
        local_138._M_node = (_Map_pointer)p_Var18[1]._M_parent;
        local_158._M_cur = (_Elt_pointer)p_Var18[1]._M_left;
        local_158._M_first = (_Elt_pointer)p_Var18[1]._M_right;
        local_158._M_last = *(_Elt_pointer *)(p_Var18 + 2);
        local_158._M_node = (_Map_pointer)p_Var18[2]._M_parent;
        std::deque<Point,std::allocator<Point>>::
        insert<std::_Deque_iterator<Point,Point&,Point*>,void>
                  (&local_178,pdVar19,&local_118,&local_138,&local_158);
      }
      std::deque<Point,_std::allocator<Point>_>::clear
                ((deque<Point,_std::allocator<Point>_> *)p_Var18);
    }
    else {
      pmVar12 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)local_1a0,&local_1c0);
      iVar4 = *pmVar12;
      pmVar12 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)p_Var7,&local_1b8);
      p_Var24 = local_1a8;
      lVar5 = *(long *)local_198;
      lVar20 = (long)iVar4 * 0x50;
      local_198 = (PathBuilder *)(lVar5 + lVar20);
      lVar23 = (long)*pmVar12 * 0x50;
      local_190 = (_Base_ptr)(lVar5 + lVar23);
      pVar28 = std::
               _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::equal_range(local_1a8,*(key_type **)(lVar5 + 0x10 + lVar23));
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::_M_erase_aux(p_Var24,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
      pmVar12 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[]((map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                            *)p_Var7,*(key_type **)(lVar5 + 0x10 + lVar23));
      *pmVar12 = iVar4;
      pVar28 = std::
               _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::equal_range(p_Var7,&local_1c0);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::_M_erase_aux(p_Var7,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
      pVar28 = std::
               _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::equal_range(p_Var7,&local_1b8);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::_M_erase_aux(p_Var7,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
      puVar3 = (undefined8 *)(lVar5 + 0x30 + lVar20);
      local_58._M_cur = (_Elt_pointer)*puVar3;
      local_58._M_first = (_Elt_pointer)puVar3[1];
      puVar3 = (undefined8 *)(lVar5 + 0x40 + lVar20);
      local_58._M_last = (_Elt_pointer)*puVar3;
      local_58._M_node = (_Map_pointer)puVar3[1];
      puVar3 = (undefined8 *)(lVar5 + 0x30 + lVar23);
      local_78.current._M_cur = (_Elt_pointer)*puVar3;
      local_78.current._M_first = (_Elt_pointer)puVar3[1];
      puVar3 = (undefined8 *)(lVar5 + 0x40 + lVar23);
      local_78.current._M_last = (_Elt_pointer)*puVar3;
      local_78.current._M_node = (_Map_pointer)puVar3[1];
      puVar3 = (undefined8 *)(lVar5 + 0x10 + lVar23);
      local_98.current._M_cur = (_Elt_pointer)*puVar3;
      local_98.current._M_first = (_Elt_pointer)puVar3[1];
      puVar3 = (undefined8 *)(lVar5 + 0x20 + lVar23);
      local_98.current._M_last = (_Elt_pointer)*puVar3;
      local_98.current._M_node = (_Map_pointer)puVar3[1];
      std::deque<Point,std::allocator<Point>>::
      insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
                (&local_178,(deque<Point,std::allocator<Point>> *)local_198,&local_58,&local_78,
                 &local_98);
      p_Var18 = local_190;
      std::deque<Point,_std::allocator<Point>_>::clear
                ((deque<Point,_std::allocator<Point>_> *)local_190);
    }
    std::deque<Point,_std::allocator<Point>_>::_M_shrink_to_fit
              ((deque<Point,_std::allocator<Point>_> *)p_Var18);
  }
  return;
}

Assistant:

void PathBuilder::add(Point a, Point b) {
    using namespace std;
    auto backs_contains_a = backs.find(a) != backs.end();
    auto backs_contains_b = backs.find(b) != backs.end();
    auto fronts_contains_a = fronts.find(a) != fronts.end();
    auto fronts_contains_b = fronts.find(b) != fronts.end();

    if (fronts_contains_a || backs_contains_b) {
        swap(a, b);
        backs_contains_a = backs.find(a) != backs.end();
        backs_contains_b = backs.find(b) != backs.end();
        fronts_contains_a = fronts.find(a) != fronts.end();
        fronts_contains_b = fronts.find(b) != fronts.end();
    }

    if (a == b) {
        return;
    }

    if (!fronts_contains_b && !backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // add a new path
        paths.emplace_back();
        paths.back().push_back(a);
        paths.back().push_back(b);
        fronts[a] = paths.size()-1;
        backs[b] = paths.size()-1;
    } else if (fronts_contains_b && backs_contains_a && (fronts[b] == backs[a]) && !backs_contains_b && !fronts_contains_a) {
        // close a loop
        paths[backs[a]].push_back(b);

        backs.erase(a);
        fronts.erase(b);
    } else if (backs_contains_b && backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = backs[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        fronts.erase(back_path.front());
        backs[back_path.front()] = front_path_index;
        backs.erase(a);
        backs.erase(b);

        front_path.insert(front_path.end(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && fronts_contains_a && !backs_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = fronts[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs.erase(back_path.back());
        fronts[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.begin(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && backs_contains_a && !fronts_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.end(), back_path.begin(), back_path.end());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && !fronts_contains_a && !backs_contains_b && !backs_contains_a) {
        // prepend to an existing path
        paths[fronts[b]].push_front(a);
        fronts[a] = fronts[b];
        fronts.erase(b);
    } else if (backs_contains_a && !fronts_contains_b && !fronts_contains_a && !backs_contains_b) {
        // append to an existing path
        paths[backs[a]].push_back(b);
        backs[b] = backs[a];
        backs.erase(a);
    } else {
        if (fronts_contains_a) {
            cerr<<"fronts contains a\n";
            cerr<<"    fronts["<<a<<"] == "<<fronts[a]<<"\n";
        }
        if (fronts_contains_b) {
            cerr<<"fronts contains b\n";
            cerr<<"    fronts["<<b<<"] == "<<fronts[b]<<"\n";
        }
        if (backs_contains_a) {
            cerr<<"backs contains a\n";
            cerr<<"    backs["<<a<<"] == "<<backs[a]<<"\n";
        }
        if (backs_contains_b) {
            cerr<<"backs contains b\n";
            cerr<<"    backs["<<b<<"] == "<<backs[b]<<"\n";
        }
        cout<<"<line x1=\""<<a.x<<"\" y1=\""<<a.y<<"\" x2=\""<<b.x<<"\" y2=\""<<b.y<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />";
        cout<<"<line x1=\""<<a.x-10<<"\" y1=\""<<a.y-10<<"\" x2=\""<<a.x-20<<"\" y2=\""<<a.y-20<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />";
        exit(32);
    }
}